

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
GetEndpoints(UA_Client *client,size_t *endpointDescriptionsSize,
            UA_EndpointDescription **endpointDescriptions)

{
  UA_String **__tv;
  long lVar1;
  long lVar2;
  undefined1 local_168 [8];
  UA_GetEndpointsRequest request;
  timeval tv;
  size_t local_40;
  UA_EndpointDescription *pUStack_38;
  
  memset(local_168,0,0xa0);
  __tv = &request.profileUris;
  gettimeofday((timeval *)__tv,(__timezone_ptr_t)0x0);
  request.requestHeader.authenticationToken.identifier.string.data =
       (UA_Byte *)
       ((long)request.profileUris * 10000000 + CONCAT44(tv.tv_sec._4_4_,(undefined4)tv.tv_sec) * 10
       + 0x19db1ded53e8000);
  request.requestHeader.auditEntryId.data._0_4_ = 10000;
  request.requestHeader.additionalHeader.content.encoded.body.data =
       (UA_Byte *)(client->endpointUrl).length;
  request.endpointUrl.length = (size_t)(client->endpointUrl).data;
  memset(__tv,0,0x98);
  __UA_Client_Service(client,local_168,UA_TYPES + 0x6e,__tv,UA_TYPES + 0x9c);
  if (tv.tv_sec._4_4_ == 0) {
    *endpointDescriptions = pUStack_38;
    *endpointDescriptionsSize = local_40;
  }
  else {
    lVar2 = 0;
    lVar1 = 0x141ba0;
    do {
      if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar2) == tv.tv_sec._4_4_) {
        lVar1 = (long)&statusCodeDescriptions[0].code + lVar2;
        break;
      }
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x1578);
    UA_LOG_ERROR((client->config).logger,UA_LOGCATEGORY_CLIENT,
                 "GetEndpointRequest failed with error code %s",*(undefined8 *)(lVar1 + 8));
  }
  deleteMembers_noInit(&request.profileUris,UA_TYPES + 0x9c);
  return tv.tv_sec._4_4_;
}

Assistant:

static UA_StatusCode
GetEndpoints(UA_Client *client, size_t* endpointDescriptionsSize,
             UA_EndpointDescription** endpointDescriptions) {
    UA_GetEndpointsRequest request;
    UA_GetEndpointsRequest_init(&request);
    request.requestHeader.timestamp = UA_DateTime_now();
    request.requestHeader.timeoutHint = 10000;
    // assume the endpointurl outlives the service call
    request.endpointUrl = client->endpointUrl; 

    UA_GetEndpointsResponse response;
    UA_GetEndpointsResponse_init(&response);
    __UA_Client_Service(client, &request, &UA_TYPES[UA_TYPES_GETENDPOINTSREQUEST],
                        &response, &UA_TYPES[UA_TYPES_GETENDPOINTSRESPONSE]);

    if(response.responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_StatusCode retval = response.responseHeader.serviceResult;
        UA_LOG_ERROR(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "GetEndpointRequest failed with error code %s",
                     UA_StatusCode_name(retval));
        UA_GetEndpointsResponse_deleteMembers(&response);
        return retval;
    }
    *endpointDescriptions = response.endpoints;
    *endpointDescriptionsSize = response.endpointsSize;
    response.endpoints = NULL;
    response.endpointsSize = 0;
    UA_GetEndpointsResponse_deleteMembers(&response);
    return UA_STATUSCODE_GOOD;
}